

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O1

void aom_int_pro_col_c(int16_t *vbuf,uint8_t *ref,int ref_stride,int width,int height,
                      int norm_factor)

{
  ulong uVar1;
  short sVar2;
  int iVar3;
  ulong uVar4;
  
  if (0 < height) {
    uVar4 = 0;
    do {
      iVar3 = 0;
      if (0 < width) {
        uVar1 = 0;
        sVar2 = 0;
        do {
          sVar2 = sVar2 + (ushort)ref[uVar1];
          uVar1 = uVar1 + 1;
        } while ((uint)width != uVar1);
        iVar3 = (int)sVar2;
      }
      vbuf[uVar4] = (int16_t)(iVar3 >> ((byte)norm_factor & 0x1f));
      ref = ref + ref_stride;
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)height);
  }
  return;
}

Assistant:

void aom_int_pro_col_c(int16_t *vbuf, const uint8_t *ref, const int ref_stride,
                       const int width, const int height, int norm_factor) {
  for (int ht = 0; ht < height; ++ht) {
    int16_t sum = 0;
    // sum: 14 bit, dynamic range [0, 32640]
    for (int idx = 0; idx < width; ++idx) sum += ref[idx];
    vbuf[ht] = sum >> norm_factor;
    ref += ref_stride;
  }
}